

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsGetGlobalObject(JsValueRef *globalObject)

{
  JsErrorCode JVar1;
  JsValueRef *local_10;
  JsValueRef *globalObject_local;
  
  local_10 = globalObject;
  JVar1 = ContextAPINoScriptWrapper_NoRecord<JsGetGlobalObject::__0>
                    ((anon_class_8_1_f1646ac0)&local_10,true,false);
  return JVar1;
}

Assistant:

CHAKRA_API JsGetGlobalObject(_Out_ JsValueRef *globalObject)
{
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(globalObject);

        *globalObject = (JsValueRef)scriptContext->GetGlobalObject();
        return JsNoError;
    },
    /*allowInObjectBeforeCollectCallback*/true);
}